

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# physical_streaming_window.cpp
# Opt level: O2

bool duckdb::PhysicalStreamingWindow::IsStreamingFunction
               (ClientContext *context,
               unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true> *expr)

{
  bool bVar1;
  uint uVar2;
  pointer this;
  BoundWindowExpression *wexpr;
  int64_t offset;
  LogicalType local_78;
  Value dflt;
  
  this = unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>::operator->
                   (expr);
  wexpr = BaseExpression::Cast<duckdb::BoundWindowExpression>(&this->super_BaseExpression);
  if ((((wexpr->partitions).
        super_vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>_>_>
        .
        super__Vector_base<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>_>_>
        ._M_impl.super__Vector_impl_data._M_start ==
        (wexpr->partitions).
        super_vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>_>_>
        .
        super__Vector_base<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>_>_>
        ._M_impl.super__Vector_impl_data._M_finish) &&
      ((wexpr->orders).
       super_vector<duckdb::BoundOrderByNode,_std::allocator<duckdb::BoundOrderByNode>_>.
       super__Vector_base<duckdb::BoundOrderByNode,_std::allocator<duckdb::BoundOrderByNode>_>.
       _M_impl.super__Vector_impl_data._M_start ==
       (wexpr->orders).
       super_vector<duckdb::BoundOrderByNode,_std::allocator<duckdb::BoundOrderByNode>_>.
       super__Vector_base<duckdb::BoundOrderByNode,_std::allocator<duckdb::BoundOrderByNode>_>.
       _M_impl.super__Vector_impl_data._M_finish)) && (wexpr->ignore_nulls == false)) {
    if ((wexpr->arg_orders).
        super_vector<duckdb::BoundOrderByNode,_std::allocator<duckdb::BoundOrderByNode>_>.
        super__Vector_base<duckdb::BoundOrderByNode,_std::allocator<duckdb::BoundOrderByNode>_>.
        _M_impl.super__Vector_impl_data._M_start !=
        (wexpr->arg_orders).
        super_vector<duckdb::BoundOrderByNode,_std::allocator<duckdb::BoundOrderByNode>_>.
        super__Vector_base<duckdb::BoundOrderByNode,_std::allocator<duckdb::BoundOrderByNode>_>.
        _M_impl.super__Vector_impl_data._M_finish) {
      return false;
    }
    if (wexpr->exclude_clause != NO_OTHER) {
      return false;
    }
    uVar2 = (wexpr->super_Expression).super_BaseExpression.type - 0x6e;
    if (uVar2 < 0x18) {
      if ((0x10ac00U >> (uVar2 & 0x1f) & 1) != 0) {
        return true;
      }
      if ((0xc00000U >> (uVar2 & 0x1f) & 1) != 0) {
        LogicalType::LogicalType(&local_78,SQLNULL);
        Value::Value(&dflt,&local_78);
        LogicalType::~LogicalType(&local_78);
        bVar1 = StreamingWindowState::LeadLagState::ComputeDefault(context,wexpr,&dflt);
        if (bVar1) {
          bVar1 = StreamingWindowState::LeadLagState::ComputeOffset(context,wexpr,&offset);
        }
        else {
          bVar1 = false;
        }
        Value::~Value(&dflt);
        return bVar1;
      }
      if (uVar2 == 0) {
        return wexpr->end == CURRENT_ROW_ROWS && wexpr->start == UNBOUNDED_PRECEDING;
      }
    }
  }
  return false;
}

Assistant:

bool PhysicalStreamingWindow::IsStreamingFunction(ClientContext &context, unique_ptr<Expression> &expr) {
	auto &wexpr = expr->Cast<BoundWindowExpression>();
	if (!wexpr.partitions.empty() || !wexpr.orders.empty() || wexpr.ignore_nulls || !wexpr.arg_orders.empty() ||
	    wexpr.exclude_clause != WindowExcludeMode::NO_OTHER) {
		return false;
	}
	switch (wexpr.GetExpressionType()) {
	// TODO: add more expression types here?
	case ExpressionType::WINDOW_AGGREGATE:
		// We can stream aggregates if they are "running totals"
		return wexpr.start == WindowBoundary::UNBOUNDED_PRECEDING && wexpr.end == WindowBoundary::CURRENT_ROW_ROWS;
	case ExpressionType::WINDOW_FIRST_VALUE:
	case ExpressionType::WINDOW_PERCENT_RANK:
	case ExpressionType::WINDOW_RANK:
	case ExpressionType::WINDOW_RANK_DENSE:
	case ExpressionType::WINDOW_ROW_NUMBER:
		return true;
	case ExpressionType::WINDOW_LAG:
	case ExpressionType::WINDOW_LEAD: {
		// We can stream LEAD/LAG if the arguments are constant and the delta is less than a block behind
		Value dflt;
		int64_t offset;
		return StreamingWindowState::LeadLagState::ComputeDefault(context, wexpr, dflt) &&
		       StreamingWindowState::LeadLagState::ComputeOffset(context, wexpr, offset);
	}
	default:
		return false;
	}
}